

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays_test_generated.h
# Opt level: O3

void __thiscall
MyGame::Example::NestedStruct::NestedStruct
          (NestedStruct *this,span<const_int,_2UL> *_a,TestEnum _b,
          span<const_MyGame::Example::TestEnum,_2UL> *_c,span<const_long,_2UL> *_d)

{
  span<const_long,_2UL> local_48;
  span<const_MyGame::Example::TestEnum,_2UL> local_38;
  span<const_int,_2UL> local_28;
  
  this->b_ = _b;
  this->padding0__ = '\0';
  this->padding1__ = 0;
  local_28.data_ = _a->data_;
  local_28.count_ = _a->count_;
  flatbuffers::Array<int,_(unsigned_short)2>::CopyFromSpan
            ((Array<int,_(unsigned_short)2> *)this,&local_28);
  local_38.data_ = _c->data_;
  local_38.count_ = _c->count_;
  flatbuffers::Array<MyGame::Example::TestEnum,_(unsigned_short)2>::CopyFromSpan
            ((Array<MyGame::Example::TestEnum,_(unsigned_short)2> *)this->c_,&local_38);
  local_48.data_ = _d->data_;
  local_48.count_ = _d->count_;
  flatbuffers::Array<long,_(unsigned_short)2>::CopyFromSpan
            ((Array<long,_(unsigned_short)2> *)this->d_,&local_48);
  return;
}

Assistant:

NestedStruct(::flatbuffers::span<const int32_t, 2> _a, MyGame::Example::TestEnum _b, ::flatbuffers::span<const MyGame::Example::TestEnum, 2> _c, ::flatbuffers::span<const int64_t, 2> _d)
      : b_(::flatbuffers::EndianScalar(static_cast<int8_t>(_b))),
        padding0__(0),
        padding1__(0) {
    ::flatbuffers::CastToArray(a_).CopyFromSpan(_a);
    ::flatbuffers::CastToArrayOfEnum<MyGame::Example::TestEnum>(c_).CopyFromSpan(_c);
    (void)padding0__;
    (void)padding1__;
    ::flatbuffers::CastToArray(d_).CopyFromSpan(_d);
  }